

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O3

void chrono::utils::WriteVisualizationAssets
               (ChSystem *system,string *filename,bool body_info,string *delim)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(const_chrono::ChBody_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsInputOutput.cpp:357:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_chrono::ChBody_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsInputOutput.cpp:357:9)>
             ::_M_manager;
  WriteVisualizationAssets
            (system,filename,(function<bool_(const_chrono::ChBody_&)> *)&local_28,body_info,delim);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void WriteVisualizationAssets(ChSystem* system, const std::string& filename, bool body_info, const std::string& delim) {
    WriteVisualizationAssets(
        system,                                        //
        filename,                                      //
        [](const ChBody& b) -> bool { return true; },  //
        body_info,                                     //
        delim);
}